

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O0

void formula_free(rpf_t *rpf)

{
  rpf_t *prVar1;
  rpf_t *tmp;
  rpf_t *rpf_local;
  
  tmp = rpf;
  while (tmp != (rpf_t *)0x0) {
    if (tmp->type == TYPE_VALUE) {
      free(tmp->value);
    }
    prVar1 = tmp->next;
    free(tmp);
    tmp = prVar1;
  }
  return;
}

Assistant:

void formula_free(struct rpf_t *rpf)
{
  for (; rpf;)
  {
    struct rpf_t *tmp;
    switch (rpf->type)
    {
      case TYPE_VALUE:
        free(rpf->value);
        break;
      case TYPE_VARIABLE:
        break;
      default:
        break;
    }
    tmp = rpf->next;
    free(rpf);
    rpf = tmp;
  }
}